

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

float Abc_NtkMfsTotalGlitchingLut(Abc_Ntk_t *pNtk,int nPats,int Prob,int fVerbose)

{
  word *pGateTruth;
  int iVar1;
  int nRegs;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int *__ptr;
  void *__s;
  Gli_Man_t *p_02;
  Abc_Obj_t *pAVar5;
  long *plVar6;
  uint *puVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  float fVar11;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                  ,0x6ee,"float Abc_NtkMfsTotalGlitchingLut(Abc_Ntk_t *, int, int, int)");
  }
  iVar2 = Abc_NtkGetFaninMax(pNtk);
  if (iVar2 < 7) {
    iVar2 = Abc_NtkGetFaninMax(pNtk);
    if (iVar2 < 7) {
      Abc_NtkToAig(pNtk);
      iVar9 = 0;
      p = Abc_NtkDfs(pNtk,0);
      p_00 = Vec_IntAlloc(6);
      p_01 = Vec_IntAlloc(0x1000);
      iVar2 = pNtk->vObjs->nSize;
      __ptr = (int *)malloc(0x10);
      iVar8 = 0x10;
      if (0xe < iVar2 - 1U) {
        iVar8 = iVar2;
      }
      *__ptr = iVar8;
      if (iVar8 == 0) {
        __s = (void *)0x0;
      }
      else {
        __s = malloc((long)iVar8 << 3);
      }
      *(void **)(__ptr + 2) = __s;
      __ptr[1] = iVar2;
      memset(__s,0,(long)iVar2 << 3);
      iVar8 = pNtk->vCis->nSize;
      iVar1 = p->nSize;
      iVar4 = pNtk->vCos->nSize;
      nRegs = pNtk->nObjCounts[8];
      iVar3 = Abc_NtkGetTotalFanins(pNtk);
      p_02 = Gli_ManAlloc(iVar8 + iVar1 + iVar4,nRegs,iVar3 + pNtk->vCos->nSize);
      for (; iVar9 < pNtk->vObjs->nSize; iVar9 = iVar9 + 1) {
        pAVar5 = Abc_NtkObj(pNtk,iVar9);
        if (pAVar5 != (Abc_Obj_t *)0x0) {
          (pAVar5->field_6).iTemp = -1;
        }
      }
      for (iVar8 = 0; iVar8 < pNtk->vCis->nSize; iVar8 = iVar8 + 1) {
        pAVar5 = Abc_NtkCi(pNtk,iVar8);
        iVar9 = Gli_ManCreateCi(p_02,(pAVar5->vFanouts).nSize);
        (pAVar5->field_6).iTemp = iVar9;
      }
      for (iVar8 = 0; iVar8 < p->nSize; iVar8 = iVar8 + 1) {
        plVar6 = (long *)Vec_PtrEntry(p,iVar8);
        p_00->nSize = 0;
        for (lVar10 = 0; lVar10 < *(int *)((long)plVar6 + 0x1c); lVar10 = lVar10 + 1) {
          Vec_IntPush(p_00,*(int *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                             (long)*(int *)(plVar6[4] + lVar10 * 4) * 8) + 0x40));
        }
        puVar7 = Hop_ManConvertAigToTruth
                           ((Hop_Man_t *)pNtk->pManFunc,(Hop_Obj_t *)plVar6[7],
                            *(int *)((long)plVar6 + 0x1c),p_01,0);
        iVar9 = (int)plVar6[2];
        if (((long)iVar9 < 0) || (iVar2 <= iVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pGateTruth = (word *)((long)__s + (long)iVar9 * 8);
        *pGateTruth = CONCAT44(puVar7[*(int *)((long)plVar6 + 0x1c) == 6],*puVar7);
        iVar9 = Gli_ManCreateNode(p_02,p_00,*(int *)((long)plVar6 + 0x2c),pGateTruth);
        *(int *)(plVar6 + 8) = iVar9;
      }
      for (iVar2 = 0; iVar2 < pNtk->vCos->nSize; iVar2 = iVar2 + 1) {
        pAVar5 = Abc_NtkCo(pNtk,iVar2);
        Gli_ManCreateCo(p_02,*(int *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] +
                                     0x40));
      }
      iVar9 = 0;
      Gli_ManSwitchesAndGlitches(p_02,4000,0.125,0);
      iVar2 = 0;
      for (iVar8 = 0; iVar8 < pNtk->vObjs->nSize; iVar8 = iVar8 + 1) {
        pAVar5 = Abc_NtkObj(pNtk,iVar8);
        if ((pAVar5 != (Abc_Obj_t *)0x0) && (-1 < (pAVar5->field_6).iTemp)) {
          iVar1 = (pAVar5->vFanouts).nSize;
          iVar4 = Gli_ObjNumSwitches(p_02,(pAVar5->field_6).iTemp);
          iVar2 = iVar2 + iVar4 * iVar1;
          iVar1 = (pAVar5->vFanouts).nSize;
          iVar4 = Gli_ObjNumGlitches(p_02,(pAVar5->field_6).iTemp);
          iVar9 = iVar9 + iVar4 * iVar1;
        }
      }
      Gli_ManStop(p_02);
      Vec_PtrFree(p);
      Vec_IntFree(p_01);
      Vec_IntFree(p_00);
      free(*(void **)(__ptr + 2));
      free(__ptr);
      if (iVar2 == 0) {
        fVar11 = 0.0;
      }
      else {
        fVar11 = ((float)(iVar9 - iVar2) * 100.0) / (float)iVar2;
      }
    }
    else {
      puts(
          "Abc_NtkMfsTotalGlitching() This procedure works only for mapped networks with LUTs size up to 6 inputs."
          );
      fVar11 = -1.0;
    }
    return fVar11;
  }
  __assert_fail("Abc_NtkGetFaninMax(pNtk) <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                ,0x6ef,"float Abc_NtkMfsTotalGlitchingLut(Abc_Ntk_t *, int, int, int)");
}

Assistant:

float Abc_NtkMfsTotalGlitchingLut( Abc_Ntk_t * pNtk, int nPats, int Prob, int fVerbose )
{
    int nSwitches, nGlitches;
    Gli_Man_t * p;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vFanins, * vTruth;
    Abc_Obj_t * pObj, * pFanin;
    Vec_Wrd_t * vTruths; word * pTruth;
    unsigned * puTruth;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( Abc_NtkGetFaninMax(pNtk) <= 6 );
    if ( Abc_NtkGetFaninMax(pNtk) > 6 )
    {
        printf( "Abc_NtkMfsTotalGlitching() This procedure works only for mapped networks with LUTs size up to 6 inputs.\n" );
        return -1.0;
    }
    Abc_NtkToAig( pNtk );
    vNodes = Abc_NtkDfs( pNtk, 0 );
    vFanins = Vec_IntAlloc( 6 );
    vTruth = Vec_IntAlloc( 1 << 12 );
    vTruths = Vec_WrdStart( Abc_NtkObjNumMax(pNtk) );

    // derive network for glitch computation
    p = Gli_ManAlloc( Vec_PtrSize(vNodes) + Abc_NtkCiNum(pNtk) + Abc_NtkCoNum(pNtk),
        Abc_NtkLatchNum(pNtk), Abc_NtkGetTotalFanins(pNtk) + Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->iTemp = -1;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = Gli_ManCreateCi( p, Abc_ObjFanoutNum(pObj) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_IntClear( vFanins );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vFanins, pFanin->iTemp );
        puTruth = Hop_ManConvertAigToTruth( (Hop_Man_t *)pNtk->pManFunc, (Hop_Obj_t *)pObj->pData, Abc_ObjFaninNum(pObj), vTruth, 0 );
        pTruth = Vec_WrdEntryP( vTruths, Abc_ObjId(pObj) );
        *pTruth = ((word)puTruth[Abc_ObjFaninNum(pObj) == 6] << 32) | (word)puTruth[0];
        pObj->iTemp = Gli_ManCreateNode( p, vFanins, Abc_ObjFanoutNum(pObj), pTruth );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        Gli_ManCreateCo( p, Abc_ObjFanin0(pObj)->iTemp );

    // compute glitching
    Gli_ManSwitchesAndGlitches( p, 4000, 1.0/8.0, 0 );

    // compute the ratio
    nSwitches = nGlitches = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->iTemp >= 0 )
        {
            nSwitches += Abc_ObjFanoutNum(pObj) * Gli_ObjNumSwitches(p, pObj->iTemp);
            nGlitches += Abc_ObjFanoutNum(pObj) * Gli_ObjNumGlitches(p, pObj->iTemp);
        }

    Gli_ManStop( p );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTruth );
    Vec_IntFree( vFanins );
    Vec_WrdFree( vTruths );
    return nSwitches ? 100.0*(nGlitches-nSwitches)/nSwitches : 0.0;
}